

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O3

void opj_destroy_cstr_info(opj_codestream_info_t *cstr_info)

{
  opj_tile_info_t *poVar1;
  long lVar2;
  long lVar3;
  
  if (cstr_info != (opj_codestream_info_t *)0x0) {
    if (0 < cstr_info->th * cstr_info->tw) {
      lVar2 = 600;
      lVar3 = 0;
      do {
        poVar1 = cstr_info->tile;
        free(*(void **)((long)poVar1 + lVar2 + -600));
        free(*(void **)((long)poVar1->pw + lVar2 + -0x48));
        free(*(void **)((long)poVar1->pw + lVar2 + -0x18));
        free(*(void **)((long)poVar1->pw + lVar2 + -0x28));
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x260;
      } while (lVar3 < (long)cstr_info->th * (long)cstr_info->tw);
    }
    free(cstr_info->tile);
    free(cstr_info->marker);
    free(cstr_info->numdecompos);
    return;
  }
  return;
}

Assistant:

void OPJ_CALLCONV opj_destroy_cstr_info(opj_codestream_info_t *cstr_info) {
	if (cstr_info) {
		int tileno;
		for (tileno = 0; tileno < cstr_info->tw * cstr_info->th; tileno++) {
			opj_tile_info_t *tile_info = &cstr_info->tile[tileno];
			opj_free(tile_info->thresh);
			opj_free(tile_info->packet);
			opj_free(tile_info->tp);
			opj_free(tile_info->marker);
		}
		opj_free(cstr_info->tile);
		opj_free(cstr_info->marker);
		opj_free(cstr_info->numdecompos);
	}
}